

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  int iVar1;
  sqlite3_stmt *pStmt_00;
  sqlite3_stmt *in_RDI;
  int rc;
  sqlite3_stmt *pStmt;
  int nBlob;
  char *pBlob;
  sqlite3_value **in_stack_00000138;
  sqlite3_stmt **in_stack_00000140;
  int in_stack_0000014c;
  Fts3Table *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sqlite3_stmt *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  if (*(int *)in_RDI == 0) {
    pStmt_00 = (sqlite3_stmt *)sqlite3_malloc(in_stack_ffffffffffffffcc);
    if (pStmt_00 == (sqlite3_stmt *)0x0) {
      *(int *)in_RDI = 7;
    }
    else {
      fts3EncodeIntArray((int)((ulong)pStmt_00 >> 0x20),
                         (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (char *)in_stack_ffffffffffffffd0,
                         (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      iVar1 = fts3SqlStmt(in_stack_00000150,in_stack_0000014c,in_stack_00000140,in_stack_00000138);
      if (iVar1 == 0) {
        sqlite3_bind_int64(pStmt_00,in_stack_ffffffffffffffdc,
                           (sqlite_int64)in_stack_ffffffffffffffd0);
        sqlite3_bind_blob(pStmt_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,iVar1,
                          (_func_void_void_ptr *)0x1c641d);
        sqlite3_step(in_RDI);
        iVar1 = sqlite3_reset(in_stack_ffffffffffffffd0);
        *(int *)in_RDI = iVar1;
      }
      else {
        sqlite3_free((void *)0x1c63d6);
        *(int *)in_RDI = iVar1;
      }
    }
  }
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc( 10*p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}